

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolui.c
# Opt level: O0

int ffgpfui(fitsfile *fptr,long group,LONGLONG firstelem,LONGLONG nelem,unsigned_short *array,
           char *nularray,int *anynul,int *status)

{
  int iVar1;
  int *in_stack_00000010;
  int nullcheck;
  long row;
  void *in_stack_000000f0;
  int in_stack_000000fc;
  LONGLONG in_stack_00000100;
  LONGLONG in_stack_00000108;
  int in_stack_00000114;
  fitsfile *in_stack_00000118;
  void *in_stack_00000160;
  char *in_stack_00000168;
  int *in_stack_00000170;
  int *in_stack_00000178;
  long in_stack_00007220;
  LONGLONG in_stack_00007228;
  LONGLONG in_stack_00007230;
  LONGLONG in_stack_00007238;
  int in_stack_00007244;
  fitsfile *in_stack_00007248;
  int in_stack_00007290;
  unsigned_short in_stack_00007298;
  unsigned_short *in_stack_000072a0;
  char *in_stack_000072a8;
  int *in_stack_000072b0;
  int *in_stack_000072b8;
  fitsfile *in_stack_ffffffffffffff68;
  int local_14;
  
  iVar1 = fits_is_compressed_image(in_stack_ffffffffffffff68,(int *)0x1b4301);
  if (iVar1 == 0) {
    ffgclui(in_stack_00007248,in_stack_00007244,in_stack_00007238,in_stack_00007230,
            in_stack_00007228,in_stack_00007220,in_stack_00007290,in_stack_00007298,
            in_stack_000072a0,in_stack_000072a8,in_stack_000072b0,in_stack_000072b8);
    local_14 = *in_stack_00000010;
  }
  else {
    fits_read_compressed_pixels
              (in_stack_00000118,in_stack_00000114,in_stack_00000108,in_stack_00000100,
               in_stack_000000fc,in_stack_000000f0,in_stack_00000160,in_stack_00000168,
               in_stack_00000170,in_stack_00000178);
    local_14 = *in_stack_00000010;
  }
  return local_14;
}

Assistant:

int ffgpfui( fitsfile *fptr,   /* I - FITS file pointer                       */
            long  group,      /* I - group to read (1 = 1st group)           */
            LONGLONG  firstelem,  /* I - first vector element to read (1 = 1st)  */
            LONGLONG  nelem,      /* I - number of values to read                */
   unsigned short *array,     /* O - array of values that are returned       */
            char *nularray,   /* O - array of null pixel flags               */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from the primary array. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
  Any undefined pixels in the returned array will be set = 0 and the 
  corresponding nularray value will be set = 1.
  ANYNUL is returned with a value of .true. if any pixels are undefined.
*/
{
    long row;
    int nullcheck = 2;

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        fits_read_compressed_pixels(fptr, TUSHORT, firstelem, nelem,
            nullcheck, NULL, array, nularray, anynul, status);
        return(*status);
    }

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    row=maxvalue(1,group);

    ffgclui(fptr, 2, row, firstelem, nelem, 1, 2, 0,
               array, nularray, anynul, status);
    return(*status);
}